

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

uint8_t * JS_GetArrayBuffer(JSContext *ctx,size_t *psize,JSValue obj)

{
  int *piVar1;
  
  if (((int)obj.tag == -1) && ((ushort)(*(short *)((long)obj.u.ptr + 6) - 0x13U) < 2)) {
    piVar1 = *(int **)((long)obj.u.ptr + 0x30);
    if (piVar1 != (int *)0x0) {
      if ((char)piVar1[1] == '\0') {
        *psize = (long)*piVar1;
        return *(uint8_t **)(piVar1 + 2);
      }
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
    }
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x13);
  }
  *psize = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *JS_GetArrayBuffer(JSContext *ctx, size_t *psize, JSValueConst obj)
{
    JSArrayBuffer *abuf = js_get_array_buffer(ctx, obj);
    if (!abuf)
        goto fail;
    if (abuf->detached) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    *psize = abuf->byte_length;
    return abuf->data;
 fail:
    *psize = 0;
    return NULL;
}